

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O2

Ref __thiscall
wasm::Wasm2JSBuilder::processExpression(wasm::Expression*,wasm::Module*,wasm::Function*,bool)::
ExpressionProcessor::makeSetVar(wasm::Expression*,wasm::Expression*,wasm::Name,wasm::NameScope_
          (void *this,Expression *curr,Expression *value,Name name,NameScope scope)

{
  size_t sVar1;
  Ref this_00;
  Ref RVar2;
  Ref RVar3;
  Ref right;
  IString IVar4;
  IString op;
  Name name_00;
  IString name_01;
  
  right.inst = name.super_IString.str._M_str;
  name_00.super_IString.str._M_str = name.super_IString.str._M_len;
  name_00.super_IString.str._M_len = (size_t)value;
  IVar4 = fromName(wasm::Name,wasm::NameScope_
                    (this,name_00,(NameScope)name.super_IString.str._M_str);
  name_01.str._M_str = IVar4.str._M_str;
  name_01.str._M_len = (size_t)name_01.str._M_str;
  this_00 = cashew::ValueBuilder::makeName((ValueBuilder *)IVar4.str._M_len,name_01);
  sVar1 = DAT_01175560;
  RVar3.inst = cashew::SET.inst;
  IVar4.str._M_str = DAT_01174ea8;
  IVar4.str._M_len = EXPRESSION_RESULT;
  RVar2 = visit(wasm::Expression*,wasm::IString_(this,curr,IVar4);
  op.str._M_str = (char *)RVar2.inst;
  op.str._M_len = sVar1;
  RVar3 = cashew::ValueBuilder::makeBinary(this_00.inst,RVar3,op,right);
  return (Ref)RVar3.inst;
}

Assistant:

Ref makeSetVar(Expression* curr,
                   Expression* value,
                   Name name,
                   NameScope scope) {
      return ValueBuilder::makeBinary(
        ValueBuilder::makeName(fromName(name, scope)),
        SET,
        visit(value, EXPRESSION_RESULT));
    }